

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

bool __thiscall
cfgfile::generator::cfg::const_class_ptr_less::operator()
          (const_class_ptr_less *this,const_class_ptr_t *c1,const_class_ptr_t *c2)

{
  longlong lVar1;
  longlong lVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined1 local_1;
  
  lVar1 = class_t::line_number((class_t *)*in_RSI);
  lVar2 = class_t::line_number((class_t *)*in_RDX);
  if (lVar1 < lVar2) {
    local_1 = true;
  }
  else {
    lVar1 = class_t::line_number((class_t *)*in_RSI);
    lVar2 = class_t::line_number((class_t *)*in_RDX);
    if (lVar1 == lVar2) {
      lVar1 = class_t::column_number((class_t *)*in_RSI);
      lVar2 = class_t::column_number((class_t *)*in_RDX);
      local_1 = lVar1 < lVar2;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool operator () ( const const_class_ptr_t & c1,
		const const_class_ptr_t & c2 )
	{
		if( c1->line_number() < c2->line_number() )
			return true;
		else if( c1->line_number() == c2->line_number() )
			return ( c1->column_number() < c2->column_number() );
		else
			return false;
	}